

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxFunctionSignature.cpp
# Opt level: O0

FunctionSignatureParts * __thiscall
Jinx::Impl::FunctionSignature::GetParameters
          (FunctionSignatureParts *__return_storage_ptr__,FunctionSignature *this)

{
  bool bVar1;
  reference_conflict1 __x;
  FunctionSignaturePart *part;
  const_iterator __end2;
  const_iterator __begin2;
  FunctionSignaturePartsI *__range2;
  FunctionSignature *this_local;
  FunctionSignatureParts *parameters;
  
  std::
  vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>::
  vector(__return_storage_ptr__);
  __end2 = std::
           vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           ::begin(&this->m_parts);
  part = (FunctionSignaturePart *)
         std::
         vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
         ::end(&this->m_parts);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
                                     *)&part), bVar1) {
    __x = __gnu_cxx::
          __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
          ::operator*(&__end2);
    if (__x->partType == Parameter) {
      std::
      vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
      ::push_back(__return_storage_ptr__,__x);
    }
    __gnu_cxx::
    __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t FunctionSignatureParts FunctionSignature::GetParameters() const
	{
		FunctionSignatureParts parameters;
		for (auto & part : m_parts)
		{
			if (part.partType == FunctionSignaturePartType::Parameter)
				parameters.push_back(part);
		}
		return parameters;
	}